

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactContainerNSC.cpp
# Opt level: O2

void chrono::
     _IntFromDescriptor<chrono::ChContactNSC<chrono::ChContactable_3vars<3,3,3>,chrono::ChContactable_1vars<3>>>
               (uint *coffset,
               list<chrono::ChContactNSC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactNSC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>_*>_>
               *contactlist,uint off_v,ChStateDelta *v,uint off_L,ChVectorDynamic<> *L,int stride)

{
  _List_node_base *p_Var1;
  
  p_Var1 = (_List_node_base *)contactlist;
  while (p_Var1 = (((_List_base<chrono::ChContactNSC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactNSC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>_*>_>
                     *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var1 != (_List_node_base *)contactlist) {
    (**(code **)(*(long *)p_Var1[1]._M_next + 0x58))(p_Var1[1]._M_next,*coffset + off_L,L);
    *coffset = *coffset + stride;
  }
  return;
}

Assistant:

void _IntFromDescriptor(unsigned int& coffset,
                        std::list<Tcont*>& contactlist,
                        const unsigned int off_v,
                        ChStateDelta& v,
                        const unsigned int off_L,
                        ChVectorDynamic<>& L,
                        const int stride) {
    typename std::list<Tcont*>::iterator itercontact = contactlist.begin();
    while (itercontact != contactlist.end()) {
        (*itercontact)->ContIntFromDescriptor(off_L + coffset, L);
        coffset += stride;
        ++itercontact;
    }
}